

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_cmpsel_vec_sparc64
               (TCGContext_conflict8 *tcg_ctx,TCGCond cond,uint vece,TCGv_vec r,TCGv_vec a,
               TCGv_vec b,TCGv_vec c,TCGv_vec d)

{
  uint uVar1;
  int iVar2;
  TCGOp *pTVar3;
  TCGv_vec r_00;
  uintptr_t o_3;
  undefined4 in_register_00000034;
  uintptr_t o;
  TCGType type;
  uintptr_t o_1;
  uintptr_t o_4;
  uintptr_t o_2;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  type = uVar1 >> 0x10 & 0xff;
  iVar2 = tcg_can_emit_vec_op_sparc64(tcg_ctx,INDEX_op_cmpsel_vec,type,vece);
  if (iVar2 < 1) {
    if (-1 < iVar2) {
      r_00 = tcg_temp_new_vec_sparc64(tcg_ctx,type);
      tcg_gen_cmp_vec_sparc64(tcg_ctx,cond,vece,r_00,a,b);
      tcg_gen_bitsel_vec_sparc64(tcg_ctx,cond,r,r_00,c,d);
      tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
      return;
    }
    tcg_expand_vec_op_sparc64
              (tcg_ctx,INDEX_op_cmpsel_vec,type,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
               a + (long)&tcg_ctx->pool_cur,b + (long)&tcg_ctx->pool_cur,
               c + (long)&tcg_ctx->pool_cur,d + (long)&tcg_ctx->pool_cur,
               CONCAT44(in_register_00000034,cond));
  }
  else {
    pTVar3 = tcg_emit_op_sparc64(tcg_ctx,INDEX_op_cmpsel_vec);
    pTVar3->field_0x1 =
         (byte)((vece << 0xc) >> 8) | (byte)((uVar1 >> 0x10) * 0x100 + 0xe00 >> 8) & 0xf;
    pTVar3->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
    pTVar3->args[1] = (TCGArg)(a + (long)&tcg_ctx->pool_cur);
    pTVar3->args[2] = (TCGArg)(b + (long)&tcg_ctx->pool_cur);
    pTVar3->args[3] = (TCGArg)(c + (long)&tcg_ctx->pool_cur);
    pTVar3->args[4] = (TCGArg)(d + (long)&tcg_ctx->pool_cur);
    pTVar3->args[5] = (ulong)cond;
  }
  return;
}

Assistant:

void tcg_gen_cmpsel_vec(TCGContext *tcg_ctx, TCGCond cond, unsigned vece, TCGv_vec r,
                        TCGv_vec a, TCGv_vec b, TCGv_vec c, TCGv_vec d)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGTemp *ct = tcgv_vec_temp(tcg_ctx, c);
    TCGTemp *dt = tcgv_vec_temp(tcg_ctx, d);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg bi = temp_arg(bt);
    TCGArg ci = temp_arg(ct);
    TCGArg di = temp_arg(dt);
    TCGType type = rt->base_type;
    const TCGOpcode *hold_list;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    tcg_debug_assert(ct->base_type >= type);
    tcg_debug_assert(dt->base_type >= type);

    tcg_assert_listed_vecop(INDEX_op_cmpsel_vec);
    hold_list = tcg_swap_vecop_list(NULL);
    can = tcg_can_emit_vec_op(tcg_ctx, INDEX_op_cmpsel_vec, type, vece);

    if (can > 0) {
        vec_gen_6(tcg_ctx, INDEX_op_cmpsel_vec, type, vece, ri, ai, bi, ci, di, cond);
    } else if (can < 0) {
        tcg_expand_vec_op(tcg_ctx, INDEX_op_cmpsel_vec, type, vece,
                          ri, ai, bi, ci, di, cond);
    } else {
        TCGv_vec t = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_cmp_vec(tcg_ctx, cond, vece, t, a, b);
        tcg_gen_bitsel_vec(tcg_ctx, vece, r, t, c, d);
        tcg_temp_free_vec(tcg_ctx, t);
    }
    tcg_swap_vecop_list(hold_list);
}